

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O0

void cdef_find_dir_dual_avx2
               (uint16_t *img1,uint16_t *img2,int stride,int32_t *var_out_1st,int32_t *var_out_2nd,
               int coeff_shift,int *out_dir_1st_8x8,int *out_dir_2nd_8x8)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int *in_RCX;
  long lVar11;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  uint in_R9D;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int *in_stack_00000008;
  __m128i t_second_8x8;
  __m128i t_first_8x8;
  __m128i cmpeg_res_11;
  __m128i cmpeg_res_10;
  __m128i cmpeg_res_01;
  __m128i cmpeg_res_00;
  __m128i second_8x8_output;
  __m128i first_8x8_output;
  __m256i max;
  __m256i dir03;
  __m256i dir47;
  __m128i src_2;
  __m128i src_1;
  int i;
  __m256i lines [8];
  __m256i const_128_reg;
  __m128i const_coeff_shift_reg;
  int best_dir [2];
  int32_t best_cost [2];
  int32_t cost_second_8x8 [8];
  int32_t cost_first_8x8 [8];
  undefined8 local_740;
  undefined8 uStackY_738;
  undefined8 local_730;
  undefined8 uStackY_728;
  undefined8 local_720;
  undefined8 uStackY_718;
  undefined8 local_710;
  undefined8 uStackY_708;
  undefined8 local_700;
  undefined8 uStackY_6f8;
  undefined8 local_6f0;
  undefined8 uStackY_6e8;
  undefined8 local_6c0;
  undefined8 uStackY_6b8;
  undefined8 uStackY_6b0;
  undefined8 uStackY_6a8;
  undefined8 local_6a0;
  undefined8 uStackY_698;
  undefined8 uStackY_690;
  undefined8 uStackY_688;
  undefined8 local_680;
  undefined8 uStackY_678;
  undefined8 uStackY_670;
  undefined8 uStackY_668;
  int local_624;
  undefined8 local_620 [16];
  int32_t *in_stack_fffffffffffffa60;
  int32_t *in_stack_fffffffffffffa68;
  __m256i *in_stack_fffffffffffffa70;
  __m256i *in_stack_fffffffffffffaa8;
  __m256i *in_stack_fffffffffffffab0;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint uStack_4dc;
  int local_4d0 [8];
  int local_4b0 [10];
  int *local_488;
  int *local_480;
  undefined1 local_460 [16];
  undefined2 local_442;
  undefined1 (*local_440) [16];
  undefined1 (*local_438) [16];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  undefined1 local_400 [32];
  ulong local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_460 = ZEXT416(in_R9D);
  auVar1 = local_460;
  local_460._4_4_ = 0;
  local_460._0_4_ = in_R9D;
  local_442 = 0x80;
  local_32 = 0x80;
  local_34 = 0x80;
  local_36 = 0x80;
  local_38 = 0x80;
  local_3a = 0x80;
  local_3c = 0x80;
  local_3e = 0x80;
  local_40 = 0x80;
  local_42 = 0x80;
  local_44 = 0x80;
  local_46 = 0x80;
  local_48 = 0x80;
  local_4a = 0x80;
  local_4c = 0x80;
  local_4e = 0x80;
  local_50 = 0x80;
  auVar3 = vpinsrw_avx(ZEXT216(0x80),0x80,1);
  auVar3 = vpinsrw_avx(auVar3,0x80,2);
  auVar3 = vpinsrw_avx(auVar3,0x80,3);
  auVar3 = vpinsrw_avx(auVar3,0x80,4);
  auVar3 = vpinsrw_avx(auVar3,0x80,5);
  auVar3 = vpinsrw_avx(auVar3,0x80,6);
  auVar3 = vpinsrw_avx(auVar3,0x80,7);
  auVar4 = vpinsrw_avx(ZEXT216(0x80),0x80,1);
  auVar4 = vpinsrw_avx(auVar4,0x80,2);
  auVar4 = vpinsrw_avx(auVar4,0x80,3);
  auVar4 = vpinsrw_avx(auVar4,0x80,4);
  auVar4 = vpinsrw_avx(auVar4,0x80,5);
  auVar4 = vpinsrw_avx(auVar4,0x80,6);
  auVar4 = vpinsrw_avx(auVar4,0x80,7);
  local_80._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
  local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar13 = local_80;
  for (local_624 = 0; local_624 < 8; local_624 = local_624 + 1) {
    local_438 = (undefined1 (*) [16])(in_RDI + (long)(local_624 * in_EDX) * 2);
    local_440 = (undefined1 (*) [16])(in_RSI + (long)(local_624 * in_EDX) * 2);
    auVar3 = *local_440;
    local_430 = *(undefined8 *)*local_438;
    uStack_428 = *(undefined8 *)(*local_438 + 8);
    auVar12._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * *local_438;
    auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    *(undefined1 (*) [32])(local_620 + (long)local_624 * 4) = auVar12;
    lVar11 = (long)local_624;
    local_3c0 = local_620[lVar11 * 4];
    uStack_3b8 = local_620[lVar11 * 4 + 1];
    uStack_3b0 = local_620[lVar11 * 4 + 2];
    uStack_3a8 = local_620[lVar11 * 4 + 3];
    local_3d0 = local_460._0_8_;
    uStack_3c8 = 0;
    auVar5._8_8_ = local_620[lVar11 * 4 + 1];
    auVar5._0_8_ = local_620[lVar11 * 4];
    auVar5._16_8_ = local_620[lVar11 * 4 + 2];
    auVar5._24_8_ = local_620[lVar11 * 4 + 3];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_460._0_8_;
    local_400 = vpsraw_avx2(auVar5,auVar3);
    uStack_510 = local_80._16_8_;
    uStack_508 = local_80._24_8_;
    local_420 = local_80._0_16_;
    auStack_410 = local_80._16_16_;
    auVar13._16_8_ = uStack_510;
    auVar13._0_16_ = local_80._0_16_;
    auVar13._24_8_ = uStack_508;
    auVar13 = vpsubw_avx2(local_400,auVar13);
    *(undefined1 (*) [32])(local_620 + (long)local_624 * 4) = auVar13;
  }
  local_488 = in_R8;
  local_480 = in_RCX;
  local_460 = auVar1;
  compute_directions_avx2
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  auVar12 = ZEXT1632(auVar13._0_16_);
  array_reverse_transpose_8x8_avx2(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  compute_directions_avx2
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  local_6a0 = auVar12._0_8_;
  uStackY_698 = auVar12._8_8_;
  uStackY_690 = auVar12._16_8_;
  uStackY_688 = auVar12._24_8_;
  local_680 = auVar13._0_8_;
  uStackY_678 = auVar13._8_8_;
  uStackY_670 = auVar13._16_8_;
  uStackY_668 = auVar13._24_8_;
  local_300 = local_6a0;
  uStack_2f8 = uStackY_698;
  uStack_2f0 = uStackY_690;
  uStack_2e8 = uStackY_688;
  local_320 = local_680;
  uStack_318 = uStackY_678;
  uStack_310 = uStackY_670;
  uStack_308 = uStackY_668;
  local_340 = vpmaxsd_avx2(auVar12,auVar13);
  local_280 = vpsrldq_avx2(local_340,8);
  local_2a0 = vpslldq_avx2(local_340,8);
  local_360 = vpor_avx2(local_280,local_2a0);
  local_380 = vpmaxsd_avx2(local_340,local_360);
  local_2c0 = vpsrldq_avx2(local_380,4);
  local_2e0 = vpslldq_avx2(local_380,0xc);
  local_3a0 = vpor_avx2(local_2c0,local_2e0);
  auVar5 = vpmaxsd_avx2(local_380,local_3a0);
  local_6c0 = auVar5._0_8_;
  uStackY_6b8 = auVar5._8_8_;
  uStackY_6b0 = auVar5._16_8_;
  uStackY_6a8 = auVar5._24_8_;
  local_200 = local_6c0;
  uStack_1f8 = uStackY_6b8;
  uStack_1f0 = uStackY_6b0;
  uStack_1e8 = uStackY_6a8;
  local_220 = local_680;
  uStack_218 = uStackY_678;
  uStack_210 = uStackY_670;
  uStack_208 = uStackY_668;
  local_170 = local_6c0;
  uStack_168 = uStackY_6b8;
  local_180 = local_680;
  uStack_178 = uStackY_678;
  auVar3 = vpcmpeqd_avx(auVar5._0_16_,auVar13._0_16_);
  local_240 = local_6a0;
  uStack_238 = uStackY_698;
  uStack_230 = uStackY_690;
  uStack_228 = uStackY_688;
  local_190 = local_6c0;
  uStack_188 = uStackY_6b8;
  local_1a0 = local_6a0;
  uStack_198 = uStackY_698;
  auVar4 = vpcmpeqd_avx(auVar5._0_16_,auVar12._0_16_);
  local_1b0 = uStackY_6b0;
  uStack_1a8 = uStackY_6a8;
  local_1c0 = uStackY_670;
  uStack_1b8 = uStackY_668;
  auVar1 = vpcmpeqd_avx(auVar5._16_16_,auVar13._16_16_);
  local_1d0 = uStackY_6b0;
  uStack_1c8 = uStackY_6a8;
  local_1e0 = uStackY_690;
  uStack_1d8 = uStackY_688;
  auVar2 = vpcmpeqd_avx(auVar5._16_16_,auVar12._16_16_);
  local_700 = auVar4._0_8_;
  uStackY_6f8 = auVar4._8_8_;
  local_6f0 = auVar3._0_8_;
  uStackY_6e8 = auVar3._8_8_;
  local_130 = local_700;
  uStack_128 = uStackY_6f8;
  local_140 = local_6f0;
  uStack_138 = uStackY_6e8;
  auVar3 = vpackssdw_avx(auVar4,auVar3);
  local_720 = auVar2._0_8_;
  uStackY_718 = auVar2._8_8_;
  local_710 = auVar1._0_8_;
  uStackY_708 = auVar1._8_8_;
  local_150 = local_720;
  uStack_148 = uStackY_718;
  local_160 = local_710;
  uStack_158 = uStackY_708;
  auVar4 = vpackssdw_avx(auVar2,auVar1);
  local_260 = local_6c0;
  uStack_258 = uStackY_6b8;
  uStack_250 = uStackY_6b0;
  uStack_248 = uStackY_6a8;
  local_f0 = local_6c0;
  uStack_e8 = uStackY_6b8;
  local_100 = local_6c0;
  uStack_f8 = uStackY_6b8;
  local_110 = uStackY_6b0;
  uStack_108 = uStackY_6a8;
  local_120 = uStackY_6b0;
  uVar7 = local_120;
  uStack_118 = uStackY_6a8;
  local_120._0_4_ = auVar5._16_4_;
  iVar6 = (int)local_120;
  local_730 = auVar3._0_8_;
  uStackY_728 = auVar3._8_8_;
  local_90 = local_730;
  uStack_88 = uStackY_728;
  local_a0 = local_730;
  uStack_98 = uStackY_728;
  local_d0 = vpacksswb_avx(auVar3,auVar3);
  uVar8 = (uint)(ushort)((ushort)(SUB161(local_d0 >> 7,0) & 1) |
                         (ushort)(SUB161(local_d0 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(local_d0 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(local_d0 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(local_d0 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(local_d0 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(local_d0 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(local_d0 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(local_d0 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(local_d0 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(local_d0 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(local_d0 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(local_d0 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(local_d0 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(local_d0 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(local_d0[0xf] >> 7) << 0xf);
  local_120 = uVar7;
  iVar9 = get_msb(uVar8 ^ uVar8 - 1);
  local_740 = auVar4._0_8_;
  uStackY_738 = auVar4._8_8_;
  local_b0 = local_740;
  uStack_a8 = uStackY_738;
  local_c0 = local_740;
  uStack_b8 = uStackY_738;
  local_e0 = vpacksswb_avx(auVar4,auVar4);
  uStack_4dc = (uint)(ushort)((ushort)(SUB161(local_e0 >> 7,0) & 1) |
                              (ushort)(SUB161(local_e0 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(local_e0 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(local_e0 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(local_e0 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(local_e0 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(local_e0 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(local_e0 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(local_e0 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(local_e0 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(local_e0 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(local_e0 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(local_e0 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(local_e0 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(local_e0 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(local_e0[0xf] >> 7) << 0xf);
  iVar10 = get_msb(uStack_4dc ^ uStack_4dc - 1);
  *local_480 = auVar5._0_4_ - local_4b0[(int)(iVar9 + 4U & 7)];
  *local_488 = iVar6 - local_4d0[(int)(iVar10 + 4U & 7)];
  *local_480 = *local_480 >> 10;
  *local_488 = *local_488 >> 10;
  *in_stack_00000008 = iVar9;
  *out_dir_1st_8x8 = iVar10;
  return;
}

Assistant:

void cdef_find_dir_dual_avx2(const uint16_t *img1, const uint16_t *img2,
                             int stride, int32_t *var_out_1st,
                             int32_t *var_out_2nd, int coeff_shift,
                             int *out_dir_1st_8x8, int *out_dir_2nd_8x8) {
  int32_t cost_first_8x8[8];
  int32_t cost_second_8x8[8];
  // Used to store the best cost for 2 8x8's.
  int32_t best_cost[2] = { 0 };
  // Best direction for 2 8x8's.
  int best_dir[2] = { 0 };

  const __m128i const_coeff_shift_reg = _mm_cvtsi32_si128(coeff_shift);
  const __m256i const_128_reg = _mm256_set1_epi16(128);
  __m256i lines[8];
  for (int i = 0; i < 8; i++) {
    const __m128i src_1 = _mm_loadu_si128((const __m128i *)&img1[i * stride]);
    const __m128i src_2 = _mm_loadu_si128((const __m128i *)&img2[i * stride]);

    lines[i] = _mm256_insertf128_si256(_mm256_castsi128_si256(src_1), src_2, 1);
    lines[i] = _mm256_sub_epi16(
        _mm256_sra_epi16(lines[i], const_coeff_shift_reg), const_128_reg);
  }

  /* Compute "mostly vertical" directions. */
  const __m256i dir47 =
      compute_directions_avx2(lines, cost_first_8x8 + 4, cost_second_8x8 + 4);

  /* Transpose and reverse the order of the lines. */
  array_reverse_transpose_8x8_avx2(lines, lines);

  /* Compute "mostly horizontal" directions. */
  const __m256i dir03 =
      compute_directions_avx2(lines, cost_first_8x8, cost_second_8x8);

  __m256i max = _mm256_max_epi32(dir03, dir47);
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 8),
                                            _mm256_slli_si256(max, 16 - (8))));
  max =
      _mm256_max_epi32(max, _mm256_or_si256(_mm256_srli_si256(max, 4),
                                            _mm256_slli_si256(max, 16 - (4))));

  const __m128i first_8x8_output = _mm256_castsi256_si128(max);
  const __m128i second_8x8_output = _mm256_extractf128_si256(max, 1);
  const __m128i cmpeg_res_00 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir47));
  const __m128i cmpeg_res_01 =
      _mm_cmpeq_epi32(first_8x8_output, _mm256_castsi256_si128(dir03));
  const __m128i cmpeg_res_10 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir47, 1));
  const __m128i cmpeg_res_11 =
      _mm_cmpeq_epi32(second_8x8_output, _mm256_extractf128_si256(dir03, 1));
  const __m128i t_first_8x8 = _mm_packs_epi32(cmpeg_res_01, cmpeg_res_00);
  const __m128i t_second_8x8 = _mm_packs_epi32(cmpeg_res_11, cmpeg_res_10);

  best_cost[0] = _mm_cvtsi128_si32(_mm256_castsi256_si128(max));
  best_cost[1] = _mm_cvtsi128_si32(second_8x8_output);
  best_dir[0] = _mm_movemask_epi8(_mm_packs_epi16(t_first_8x8, t_first_8x8));
  best_dir[0] =
      get_msb(best_dir[0] ^ (best_dir[0] - 1));  // Count trailing zeros
  best_dir[1] = _mm_movemask_epi8(_mm_packs_epi16(t_second_8x8, t_second_8x8));
  best_dir[1] =
      get_msb(best_dir[1] ^ (best_dir[1] - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var_out_1st = best_cost[0] - cost_first_8x8[(best_dir[0] + 4) & 7];
  *var_out_2nd = best_cost[1] - cost_second_8x8[(best_dir[1] + 4) & 7];

  /* We'd normally divide by 840, but dividing by 1024 is close enough
  for what we're going to do with this. */
  *var_out_1st >>= 10;
  *var_out_2nd >>= 10;
  *out_dir_1st_8x8 = best_dir[0];
  *out_dir_2nd_8x8 = best_dir[1];
}